

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O2

void __thiscall
sc_core::sc_signal_t<bool,_(sc_core::sc_writer_policy)3>::do_update
          (sc_signal_t<bool,_(sc_core::sc_writer_policy)3> *this)

{
  sc_signal_channel::do_update(&this->super_sc_signal_channel);
  this->m_cur_val = this->m_new_val;
  return;
}

Assistant:

inline void
sc_signal_t<T,POL>::do_update()
{
    base_type::do_update();
    m_cur_val = m_new_val;
}